

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SamplePosQueryCase::init
          (SamplePosQueryCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget *pRVar1;
  NotSupportedError *this_00;
  string local_40;
  
  pRVar1 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar1->m_numSamples != 0) {
    return (int)pRVar1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"No multisample buffers","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SamplePosQueryCase::init (void)
{
	if (m_context.getRenderTarget().getNumSamples() == 0)
		throw tcu::NotSupportedError("No multisample buffers");
}